

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilerBuffer.cpp
# Opt level: O2

void __thiscall helics::ProfilerBuffer::~ProfilerBuffer(ProfilerBuffer *this)

{
  if ((this->mBuffers).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->mBuffers).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    writeFile(this);
  }
  std::__cxx11::string::~string((string *)&this->mFileName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this);
  return;
}

Assistant:

ProfilerBuffer::~ProfilerBuffer()
{
    try {
        if (!mBuffers.empty()) {
            writeFile();
        }
    }
    catch (const std::ios_base::failure&) {
    }
}